

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixMatrix.h
# Opt level: O2

void Eigen::internal::general_matrix_matrix_product<long,_double,_0,_false,_double,_0,_false,_0>::
     run(long rows,long cols,long depth,double *_lhs,long lhsStride,double *_rhs,long rhsStride,
        ResScalar *res,long resStride,ResScalar alpha,level3_blocking<double,_double> *blocking,
        GemmParallelInfo<long> *info)

{
  ulong size;
  size_t size_00;
  long lVar1;
  RhsScalar *pRVar2;
  long lVar3;
  double *pdVar4;
  long lVar5;
  ResScalar *res_00;
  long lVar6;
  double *pdVar7;
  long lVar8;
  double *pdVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  undefined1 local_118 [8];
  aligned_stack_memory_handler<double> blockA_stack_memory_destructor;
  aligned_stack_memory_handler<double> blockB_stack_memory_destructor;
  aligned_stack_memory_handler<double> blockW_stack_memory_destructor;
  double *local_50;
  double *local_48;
  gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false> local_33;
  gemm_pack_rhs<double,_long,_4,_0,_false,_false> local_32;
  gebp_kernel<double,_double,_long,_4,_4,_false,_false> local_31 [6];
  gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false> pack_lhs;
  gemm_pack_rhs<double,_long,_4,_0,_false,_false> pack_rhs;
  gebp_kernel<double,_double,_long,_4,_4,_false,_false> gebp;
  
  pdVar4 = (double *)local_118;
  lVar1 = blocking->m_kc;
  lVar6 = blocking->m_mc;
  if (rows <= blocking->m_mc) {
    lVar6 = rows;
  }
  pdVar7 = (double *)(lVar6 * lVar1);
  if ((ulong)pdVar7 >> 0x3d != 0) {
    throw_std_bad_alloc();
  }
  pdVar9 = (double *)(lVar1 * cols);
  size = (long)pdVar7 * 8;
  if (blocking->m_blockA == (LhsScalar *)0x0) {
    if (size < 0x20001) {
      local_118 = (undefined1  [8])(local_118 + -(size + 0xf & 0xfffffffffffffff0));
      blockA_stack_memory_destructor.m_size._0_1_ = false;
      pdVar4 = (double *)local_118;
      local_50 = (double *)local_118;
    }
    else {
      local_50 = (double *)aligned_malloc(size);
      local_118 = (undefined1  [8])(double *)0x0;
      if (blocking->m_blockA == (LhsScalar *)0x0) {
        local_118 = (undefined1  [8])local_50;
      }
      blockA_stack_memory_destructor.m_size._0_1_ = true;
    }
  }
  else {
    blockA_stack_memory_destructor.m_size._0_1_ = 0x20000 < size;
    local_118 = (undefined1  [8])0x0;
    pdVar4 = (double *)local_118;
    local_50 = blocking->m_blockA;
  }
  blockA_stack_memory_destructor.m_ptr = pdVar7;
  if ((double *)0x1fffffffffffffff < pdVar9) {
    pdVar4[-1] = 5.31187268141529e-318;
    throw_std_bad_alloc();
  }
  size_00 = (long)pdVar9 * 8;
  if (blocking->m_blockB == (RhsScalar *)0x0) {
    if (size_00 < 0x20001) {
      pdVar4 = (double *)((long)pdVar4 - (size_00 + 0xf & 0xfffffffffffffff0));
      blockA_stack_memory_destructor._16_8_ = pdVar4;
      local_48 = pdVar4;
    }
    else {
      pdVar4[-1] = 5.31219382408508e-318;
      local_48 = (double *)aligned_malloc(size_00);
      blockA_stack_memory_destructor._16_8_ = (double *)0x0;
      if (blocking->m_blockB == (RhsScalar *)0x0) {
        blockA_stack_memory_destructor._16_8_ = local_48;
      }
    }
  }
  else {
    blockA_stack_memory_destructor._16_8_ = (double *)0x0;
    local_48 = blocking->m_blockB;
  }
  blockB_stack_memory_destructor.m_ptr = pdVar9;
  blockB_stack_memory_destructor.m_size._0_1_ = 0x20000 < size_00;
  if (0x1fffffffffffffff < (ulong)(lVar1 * 8)) {
    pdVar4[-1] = 5.31256437331946e-318;
    throw_std_bad_alloc();
  }
  pRVar2 = blocking->m_blockW;
  if (pRVar2 == (RhsScalar *)0x0) {
    if ((ulong)(lVar1 * 0x40) < 0x20001) {
      pRVar2 = pdVar4 + lVar1 * -8;
      blockB_stack_memory_destructor._16_8_ = pRVar2;
      pdVar4 = pRVar2;
    }
    else {
      pdVar4[-1] = 5.31286081270697e-318;
      pRVar2 = (RhsScalar *)aligned_malloc(lVar1 * 0x40);
      blockB_stack_memory_destructor._16_8_ = (RhsScalar *)0x0;
      if (blocking->m_blockW == (RhsScalar *)0x0) {
        blockB_stack_memory_destructor._16_8_ = pRVar2;
      }
    }
  }
  else {
    blockB_stack_memory_destructor._16_8_ = (RhsScalar *)0x0;
  }
  lVar10 = 0;
  while (lVar10 < depth) {
    lVar5 = lVar1 + lVar10;
    lVar8 = depth;
    if (lVar5 < depth) {
      lVar8 = lVar5;
    }
    lVar8 = lVar8 - lVar10;
    pdVar4[-2] = 0.0;
    pdVar4[-1] = 0.0;
    pdVar4[-3] = 5.31370566496136e-318;
    gemm_pack_rhs<double,_long,_4,_0,_false,_false>::operator()
              (&local_32,local_48,_rhs + lVar10,rhsStride,lVar8,cols,(long)pdVar4[-2],
               (long)pdVar4[-1]);
    lVar11 = 0;
    lVar3 = 0;
    res_00 = res;
    pdVar7 = _lhs;
    lVar10 = lVar6;
    while( true ) {
      lVar12 = lVar10;
      if (rows < lVar10) {
        lVar12 = rows;
      }
      if (rows <= lVar3) break;
      lVar12 = lVar12 + lVar11;
      pdVar4[-2] = 0.0;
      pdVar4[-1] = 0.0;
      pdVar4[-3] = 5.31422937454595e-318;
      gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false>::operator()
                (&local_33,local_50,pdVar7,lhsStride,lVar8,lVar12,(long)pdVar4[-2],(long)pdVar4[-1])
      ;
      lVar3 = lVar3 + lVar6;
      pdVar7 = pdVar7 + lVar6;
      lVar10 = lVar10 + lVar6;
      lVar11 = lVar11 - lVar6;
      pdVar4[-2] = (double)pRVar2;
      pdVar4[-4] = 0.0;
      pdVar4[-3] = 0.0;
      pdVar4[-5] = -NAN;
      pdVar4[-7] = (double)cols;
      pdVar4[-6] = -NAN;
      pdVar4[-8] = (double)lVar8;
      pdVar4[-9] = 5.31489142251138e-318;
      gebp_kernel<double,_double,_long,_4,_4,_false,_false>::operator()
                (local_31,res_00,resStride,local_50,local_48,lVar12,(long)pdVar4[-8],
                 (long)pdVar4[-7],alpha,(long)pdVar4[-6],(long)pdVar4[-5],(long)pdVar4[-4],
                 (long)pdVar4[-3],(double *)pdVar4[-2]);
      res_00 = res_00 + lVar6;
    }
    _lhs = _lhs + lVar1 * lhsStride;
    lVar10 = lVar5;
  }
  pdVar4[-1] = 5.31516315861659e-318;
  aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)&blockB_stack_memory_destructor.m_deallocate);
  pdVar4[-1] = 5.31522244649409e-318;
  aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)&blockA_stack_memory_destructor.m_deallocate);
  pdVar4[-1] = 5.31528173437159e-318;
  aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)local_118);
  return;
}

Assistant:

static void run(Index rows, Index cols, Index depth,
  const LhsScalar* _lhs, Index lhsStride,
  const RhsScalar* _rhs, Index rhsStride,
  ResScalar* res, Index resStride,
  ResScalar alpha,
  level3_blocking<LhsScalar,RhsScalar>& blocking,
  GemmParallelInfo<Index>* info = 0)
{
  const_blas_data_mapper<LhsScalar, Index, LhsStorageOrder> lhs(_lhs,lhsStride);
  const_blas_data_mapper<RhsScalar, Index, RhsStorageOrder> rhs(_rhs,rhsStride);

  typedef gebp_traits<LhsScalar,RhsScalar> Traits;

  Index kc = blocking.kc();                   // cache block size along the K direction
  Index mc = (std::min)(rows,blocking.mc());  // cache block size along the M direction
  //Index nc = blocking.nc(); // cache block size along the N direction

  gemm_pack_lhs<LhsScalar, Index, Traits::mr, Traits::LhsProgress, LhsStorageOrder> pack_lhs;
  gemm_pack_rhs<RhsScalar, Index, Traits::nr, RhsStorageOrder> pack_rhs;
  gebp_kernel<LhsScalar, RhsScalar, Index, Traits::mr, Traits::nr, ConjugateLhs, ConjugateRhs> gebp;

#ifdef EIGEN_HAS_OPENMP
  if(info)
  {
    // this is the parallel version!
    Index tid = omp_get_thread_num();
    Index threads = omp_get_num_threads();
    
    std::size_t sizeA = kc*mc;
    std::size_t sizeW = kc*Traits::WorkSpaceFactor;
    ei_declare_aligned_stack_constructed_variable(LhsScalar, blockA, sizeA, 0);
    ei_declare_aligned_stack_constructed_variable(RhsScalar, w, sizeW, 0);
    
    RhsScalar* blockB = blocking.blockB();
    eigen_internal_assert(blockB!=0);

    // For each horizontal panel of the rhs, and corresponding vertical panel of the lhs...
    for(Index k=0; k<depth; k+=kc)
    {
      const Index actual_kc = (std::min)(k+kc,depth)-k; // => rows of B', and cols of the A'

      // In order to reduce the chance that a thread has to wait for the other,
      // let's start by packing A'.
      pack_lhs(blockA, &lhs(0,k), lhsStride, actual_kc, mc);

      // Pack B_k to B' in a parallel fashion:
      // each thread packs the sub block B_k,j to B'_j where j is the thread id.

      // However, before copying to B'_j, we have to make sure that no other thread is still using it,
      // i.e., we test that info[tid].users equals 0.
      // Then, we set info[tid].users to the number of threads to mark that all other threads are going to use it.
      while(info[tid].users!=0) {}
      info[tid].users += threads;

      pack_rhs(blockB+info[tid].rhs_start*actual_kc, &rhs(k,info[tid].rhs_start), rhsStride, actual_kc, info[tid].rhs_length);

      // Notify the other threads that the part B'_j is ready to go.
      info[tid].sync = k;

      // Computes C_i += A' * B' per B'_j
      for(Index shift=0; shift<threads; ++shift)
      {
        Index j = (tid+shift)%threads;

        // At this point we have to make sure that B'_j has been updated by the thread j,
        // we use testAndSetOrdered to mimic a volatile access.
        // However, no need to wait for the B' part which has been updated by the current thread!
        if(shift>0)
          while(info[j].sync!=k) {}

        gebp(res+info[j].rhs_start*resStride, resStride, blockA, blockB+info[j].rhs_start*actual_kc, mc, actual_kc, info[j].rhs_length, alpha, -1,-1,0,0, w);
      }

      // Then keep going as usual with the remaining A'
      for(Index i=mc; i<rows; i+=mc)
      {
        const Index actual_mc = (std::min)(i+mc,rows)-i;

        // pack A_i,k to A'
        pack_lhs(blockA, &lhs(i,k), lhsStride, actual_kc, actual_mc);

        // C_i += A' * B'
        gebp(res+i, resStride, blockA, blockB, actual_mc, actual_kc, cols, alpha, -1,-1,0,0, w);
      }

      // Release all the sub blocks B'_j of B' for the current thread,
      // i.e., we simply decrement the number of users by 1
      for(Index j=0; j<threads; ++j)
      {
        #pragma omp atomic
        info[j].users -= 1;
      }
    }
  }
  else
#endif // EIGEN_HAS_OPENMP
  {
    EIGEN_UNUSED_VARIABLE(info);

    // this is the sequential version!
    std::size_t sizeA = kc*mc;
    std::size_t sizeB = kc*cols;
    std::size_t sizeW = kc*Traits::WorkSpaceFactor;

    ei_declare_aligned_stack_constructed_variable(LhsScalar, blockA, sizeA, blocking.blockA());
    ei_declare_aligned_stack_constructed_variable(RhsScalar, blockB, sizeB, blocking.blockB());
    ei_declare_aligned_stack_constructed_variable(RhsScalar, blockW, sizeW, blocking.blockW());

    // For each horizontal panel of the rhs, and corresponding panel of the lhs...
    // (==GEMM_VAR1)
    for(Index k2=0; k2<depth; k2+=kc)
    {
      const Index actual_kc = (std::min)(k2+kc,depth)-k2;

      // OK, here we have selected one horizontal panel of rhs and one vertical panel of lhs.
      // => Pack rhs's panel into a sequential chunk of memory (L2 caching)
      // Note that this panel will be read as many times as the number of blocks in the lhs's
      // vertical panel which is, in practice, a very low number.
      pack_rhs(blockB, &rhs(k2,0), rhsStride, actual_kc, cols);

      // For each mc x kc block of the lhs's vertical panel...
      // (==GEPP_VAR1)
      for(Index i2=0; i2<rows; i2+=mc)
      {
        const Index actual_mc = (std::min)(i2+mc,rows)-i2;

        // We pack the lhs's block into a sequential chunk of memory (L1 caching)
        // Note that this block will be read a very high number of times, which is equal to the number of
        // micro vertical panel of the large rhs's panel (e.g., cols/4 times).
        pack_lhs(blockA, &lhs(i2,k2), lhsStride, actual_kc, actual_mc);

        // Everything is packed, we can now call the block * panel kernel:
        gebp(res+i2, resStride, blockA, blockB, actual_mc, actual_kc, cols, alpha, -1, -1, 0, 0, blockW);
      }
    }
  }
}